

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::StructFilter::Deserialize(StructFilter *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var3;
  StructFilter *this_00;
  pointer *__ptr;
  TableFilter *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> child_name;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  TableFilter local_70;
  undefined1 local_60;
  undefined8 local_5f;
  undefined4 local_57;
  undefined2 local_53;
  char local_51;
  string local_50;
  idx_t child_idx_p;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"child_idx");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    child_idx_p = 0;
  }
  else {
    iVar2 = (*pp_Var3[0x15])(deserializer);
    child_idx_p = CONCAT44(extraout_var,iVar2);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"child_name");
  if ((char)iVar2 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_60 = 0;
    local_90 = &local_80;
    local_80._M_local_buf[0] = '\0';
    local_80._M_allocated_capacity._1_7_ = (undefined7)local_5f;
    local_80._M_local_buf[8] = (char)((ulong)local_5f >> 0x38);
    local_80._9_4_ = local_57;
    local_80._13_2_ = local_53;
    local_80._M_local_buf[0xf] = local_51;
    local_88 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_90,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"child_filter");
  pTVar4 = (TableFilter *)0x0;
  if ((char)iVar2 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      pTVar4 = (TableFilter *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      TableFilter::Deserialize(&local_70,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pTVar4 = (TableFilter *)local_70._vptr_TableFilter;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (StructFilter *)operator_new(0x40);
  if (local_90 == &local_80) {
    local_50.field_2._8_8_ =
         CONCAT17(local_80._M_local_buf[0xf],
                  CONCAT25(local_80._13_2_,CONCAT41(local_80._9_4_,local_80._M_local_buf[8])));
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)local_90;
  }
  local_50.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_50.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_50._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_98._M_head_impl = pTVar4;
  local_90 = &local_80;
  StructFilter(this_00,child_idx_p,&local_50,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_98);
  if (local_98._M_head_impl != (TableFilter *)0x0) {
    (*(local_98._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_98._M_head_impl = (TableFilter *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> StructFilter::Deserialize(Deserializer &deserializer) {
	auto child_idx = deserializer.ReadPropertyWithDefault<idx_t>(200, "child_idx");
	auto child_name = deserializer.ReadPropertyWithDefault<string>(201, "child_name");
	auto child_filter = deserializer.ReadPropertyWithDefault<unique_ptr<TableFilter>>(202, "child_filter");
	auto result = duckdb::unique_ptr<StructFilter>(new StructFilter(child_idx, std::move(child_name), std::move(child_filter)));
	return std::move(result);
}